

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep.c
# Opt level: O0

int arkStep_AttachLinsol
              (ARKodeMem ark_mem,ARKLinsolInitFn linit,ARKLinsolSetupFn lsetup,
              ARKLinsolSolveFn lsolve,ARKLinsolFreeFn lfree,SUNLinearSolver_Type lsolve_type,
              void *lmem)

{
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  undefined8 in_R8;
  undefined4 in_R9D;
  int retval;
  ARKodeARKStepMem step_mem;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  char *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  int local_4;
  
  local_4 = arkStep_AccessStepMem
                      ((ARKodeMem)CONCAT44(in_R9D,in_stack_ffffffffffffffc8),
                       in_stack_ffffffffffffffc0,
                       (ARKodeARKStepMem *)
                       CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  if (local_4 == 0) {
    if (*(long *)(in_stack_ffffffffffffffc0 + 0x138) != 0) {
      (**(code **)(in_stack_ffffffffffffffc0 + 0x138))(in_RDI);
    }
    *(undefined8 *)(in_stack_ffffffffffffffc0 + 0x120) = in_RSI;
    *(undefined8 *)(in_stack_ffffffffffffffc0 + 0x128) = in_RDX;
    *(undefined8 *)(in_stack_ffffffffffffffc0 + 0x130) = in_RCX;
    *(undefined8 *)(in_stack_ffffffffffffffc0 + 0x138) = in_R8;
    *(ARKodeARKStepMem *)(in_stack_ffffffffffffffc0 + 0x140) = step_mem;
    *(undefined4 *)(in_stack_ffffffffffffffc0 + 0x148) = in_R9D;
    in_stack_ffffffffffffffc0[0x198] = '\0';
    in_stack_ffffffffffffffc0[0x199] = '\0';
    in_stack_ffffffffffffffc0[0x19a] = '\0';
    in_stack_ffffffffffffffc0[0x19b] = '\0';
    in_stack_ffffffffffffffc0[0x19c] = '\0';
    in_stack_ffffffffffffffc0[0x19d] = '\0';
    in_stack_ffffffffffffffc0[0x19e] = '\0';
    in_stack_ffffffffffffffc0[0x19f] = '\0';
    in_stack_ffffffffffffffc0[0x100] = '\0';
    in_stack_ffffffffffffffc0[0x101] = '\0';
    in_stack_ffffffffffffffc0[0x102] = '\0';
    in_stack_ffffffffffffffc0[0x103] = '\0';
    in_stack_ffffffffffffffc0[0x104] = '\0';
    in_stack_ffffffffffffffc0[0x105] = '\0';
    in_stack_ffffffffffffffc0[0x106] = '\0';
    in_stack_ffffffffffffffc0[0x107] = '\0';
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int arkStep_AttachLinsol(ARKodeMem ark_mem, ARKLinsolInitFn linit,
                         ARKLinsolSetupFn lsetup, ARKLinsolSolveFn lsolve,
                         ARKLinsolFreeFn lfree,
                         SUNLinearSolver_Type lsolve_type, void* lmem)
{
  ARKodeARKStepMem step_mem;
  int retval;

  /* access ARKodeARKStepMem structure */
  retval = arkStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* free any existing system solver */
  if (step_mem->lfree != NULL) { step_mem->lfree(ark_mem); }

  /* Attach the provided routines, data structure and solve type */
  step_mem->linit       = linit;
  step_mem->lsetup      = lsetup;
  step_mem->lsolve      = lsolve;
  step_mem->lfree       = lfree;
  step_mem->lmem        = lmem;
  step_mem->lsolve_type = lsolve_type;

  /* Reset all linear solver counters */
  step_mem->nsetups = 0;
  step_mem->nstlp   = 0;

  return (ARK_SUCCESS);
}